

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void corruptSchema(InitData *pData,char **azObj,char *zExtra)

{
  sqlite3 *db;
  uint uVar1;
  int iVar2;
  char *pcVar3;
  
  db = pData->db;
  if (db->mallocFailed == '\0') {
    if (*pData->pzErrMsg != (char *)0x0) {
      return;
    }
    uVar1 = pData->mInitFlags & 3;
    if (uVar1 == 0) {
      if ((db->flags & 1) == 0) {
        pcVar3 = "?";
        if (azObj[1] != (char *)0x0) {
          pcVar3 = azObj[1];
        }
        pcVar3 = sqlite3MPrintf(db,"malformed database schema (%s)",pcVar3);
        if ((zExtra != (char *)0x0) && (*zExtra != '\0')) {
          pcVar3 = sqlite3MPrintf(db,"%z - %s",pcVar3,zExtra);
        }
        *pData->pzErrMsg = pcVar3;
        iVar2 = 0x22dd8;
      }
      else {
        iVar2 = 0x22dd1;
      }
      iVar2 = sqlite3CorruptError(iVar2);
    }
    else {
      pcVar3 = sqlite3MPrintf(db,"error in %s %s after %s: %s",*azObj,azObj[1],
                              corruptSchema_azAlterType_rel +
                              *(int *)(corruptSchema_azAlterType_rel + (ulong)(uVar1 - 1) * 4),
                              zExtra);
      *pData->pzErrMsg = pcVar3;
      iVar2 = 1;
    }
  }
  else {
    iVar2 = 7;
  }
  pData->rc = iVar2;
  return;
}

Assistant:

static void corruptSchema(
  InitData *pData,     /* Initialization context */
  char **azObj,        /* Type and name of object being parsed */
  const char *zExtra   /* Error information */
){
  sqlite3 *db = pData->db;
  if( db->mallocFailed ){
    pData->rc = SQLITE_NOMEM_BKPT;
  }else if( pData->pzErrMsg[0]!=0 ){
    /* A error message has already been generated.  Do not overwrite it */
  }else if( pData->mInitFlags & (INITFLAG_AlterMask) ){
    static const char *azAlterType[] = {
       "rename",
       "drop column",
       "add column"
    };
    *pData->pzErrMsg = sqlite3MPrintf(db,
        "error in %s %s after %s: %s", azObj[0], azObj[1],
        azAlterType[(pData->mInitFlags&INITFLAG_AlterMask)-1],
        zExtra
    );
    pData->rc = SQLITE_ERROR;
  }else if( db->flags & SQLITE_WriteSchema ){
    pData->rc = SQLITE_CORRUPT_BKPT;
  }else{
    char *z;
    const char *zObj = azObj[1] ? azObj[1] : "?";
    z = sqlite3MPrintf(db, "malformed database schema (%s)", zObj);
    if( zExtra && zExtra[0] ) z = sqlite3MPrintf(db, "%z - %s", z, zExtra);
    *pData->pzErrMsg = z;
    pData->rc = SQLITE_CORRUPT_BKPT;
  }
}